

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void update_next_job_info(AV1CdefSync *cdef_sync,int nvfb,int nhfb)

{
  int nhfb_local;
  int nvfb_local;
  AV1CdefSync *cdef_sync_local;
  
  cdef_sync->fbc = cdef_sync->fbc + 1;
  if (cdef_sync->fbc == nhfb) {
    cdef_sync->fbr = cdef_sync->fbr + 1;
    if (cdef_sync->fbr == nvfb) {
      cdef_sync->end_of_frame = 1;
    }
    else {
      cdef_sync->fbc = 0;
    }
  }
  return;
}

Assistant:

static void update_next_job_info(AV1CdefSync *cdef_sync, int nvfb, int nhfb) {
  cdef_sync->fbc++;
  if (cdef_sync->fbc == nhfb) {
    cdef_sync->fbr++;
    if (cdef_sync->fbr == nvfb) {
      cdef_sync->end_of_frame = 1;
    } else {
      cdef_sync->fbc = 0;
    }
  }
}